

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::printMap(Map *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ostream *poVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> countriesInCurrContinent;
  string currContinent;
  string currCountryName;
  _Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_> local_88;
  string local_70;
  string local_50;
  
  ppCVar1 = (this->pMapContinents->
            super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar4 = (this->pMapContinents->
                 super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
    Continent::getContinentName_abi_cxx11_(&local_70,*ppCVar4);
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
              ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&local_88,
               (*ppCVar4)->pCountriesInContinent);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             " \n\n\n ######################## \n COUNTRIES IN CONTINENT : ");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::operator<<(poVar3,"\n ######################## \n");
    ppCVar2 = local_88._M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar5 = local_88._M_impl.super__Vector_impl_data._M_start; ppCVar5 != ppCVar2;
        ppCVar5 = ppCVar5 + 1) {
      Country::getCountryName_abi_cxx11_(&local_50,*ppCVar5);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
      poVar3 = std::operator<<(poVar3," is owned by player ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(*ppCVar5)->pPlayerOwnerId);
      poVar3 = std::operator<<(poVar3," and has ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(*ppCVar5)->pNumberOfTroops);
      std::operator<<(poVar3," troops \n");
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::_Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>::~_Vector_base(&local_88);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void Map::printMap() {
    for (auto& pMapContinent : *this->pMapContinents) {
        std::string currContinent = pMapContinent->getContinentName();
        std::vector<Map::Country*> countriesInCurrContinent = *pMapContinent->getCountriesInContinent();
        std::cout << " \n\n\n ######################## \n COUNTRIES IN CONTINENT : " << currContinent
                  << "\n ######################## \n";
        for (auto& j : countriesInCurrContinent) {
            std::string currCountryName = j->getCountryName();
            std::cout << currCountryName << " is owned by player " << j->getPlayerOwnerID() <<" and has " << j->getNumberOfTroops() << " troops \n";
        }
    }
}